

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_sse42_intr.c
# Opt level: O1

void ihevc_intra_pred_chroma_planar_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_R10;
  undefined6 uVar5;
  ulong uVar4;
  ulong uVar6;
  short sVar7;
  short sVar9;
  undefined1 auVar8 [16];
  short sVar10;
  short sVar12;
  undefined1 auVar11 [16];
  short sVar13;
  short sVar15;
  undefined1 auVar14 [16];
  short sVar16;
  short sVar18;
  undefined1 auVar17 [16];
  undefined1 in_XMM4 [16];
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar22 [16];
  short sVar23;
  short sVar25;
  undefined1 auVar24 [16];
  short sVar26;
  short sVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  undefined1 in_XMM13 [16];
  undefined1 auVar38 [16];
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  
  uVar5 = (undefined6)((ulong)in_R10 >> 0x10);
  if (nt == 4) {
    uVar2 = (uint)CONCAT62(uVar5,3);
  }
  else if (nt == 8) {
    uVar2 = (uint)CONCAT62(uVar5,4);
  }
  else {
    uVar2 = (uint)CONCAT62(uVar5,6);
    if (nt == 0x10) {
      uVar2 = (uint)CONCAT62(uVar5,5);
    }
  }
  if (0 < nt && (nt & 3U) == 0) {
    auVar8 = pmovzxbw(ZEXT216(*(ushort *)(pu1_ref + (nt * 6 + 2))),
                      ZEXT216(*(ushort *)(pu1_ref + (nt * 6 + 2))));
    uVar1 = nt - 1;
    auVar11 = pmovzxbw(ZEXT216(*(ushort *)(pu1_ref + (long)nt * 2 + -2)),
                       ZEXT216(*(ushort *)(pu1_ref + (long)nt * 2 + -2)));
    auVar14 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
    auVar17 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0);
    sVar16 = auVar17._0_2_;
    sVar18 = auVar17._2_2_;
    uVar4 = 0;
    auVar17 = pmovsxbw(in_XMM4,0x404030302020101);
    auVar20 = pmovzxwq(ZEXT416(uVar2),ZEXT416(uVar2));
    auVar21 = pmovsxbw(in_XMM6,0xfcfcfcfcfcfcfcfc);
    auVar22 = pmovsxbw(in_XMM7,0x404040404040404);
    do {
      auVar24 = pmovzxbw(ZEXT216(*(ushort *)(pu1_ref + (~uVar4 + (ulong)(uint)(nt * 2)) * 2)),
                         ZEXT216(*(ushort *)(pu1_ref + (~uVar4 + (ulong)(uint)(nt * 2)) * 2)));
      iVar3 = (int)uVar4;
      uVar4 = uVar4 + 1;
      auVar27 = pshuflw(ZEXT416((uint)uVar4),ZEXT416((uint)uVar4),0);
      sVar10 = auVar11._0_2_;
      sVar26 = auVar27._0_2_;
      sVar12 = auVar11._2_2_;
      sVar28 = auVar27._2_2_;
      sVar13 = auVar14._0_2_;
      sVar15 = auVar14._2_2_;
      auVar27 = ZEXT416(uVar1 - iVar3);
      auVar29 = pshuflw(auVar27,auVar27,0);
      uVar6 = 0;
      auVar27 = auVar17;
      sVar30 = sVar16;
      sVar31 = sVar18;
      sVar32 = sVar16 + -1;
      sVar33 = sVar18 + -1;
      sVar34 = sVar16 + -2;
      sVar35 = sVar18 + -2;
      sVar36 = sVar16 + -3;
      sVar37 = sVar18 + -3;
      do {
        auVar38 = pmovzxbw(in_XMM13,*(undefined8 *)(pu1_ref + uVar6 + (long)(nt * 4) + 2));
        sVar7 = auVar29._0_2_;
        in_XMM13._0_2_ = auVar38._0_2_ * sVar7;
        sVar9 = auVar29._2_2_;
        in_XMM13._2_2_ = auVar38._2_2_ * sVar9;
        in_XMM13._4_2_ = auVar38._4_2_ * sVar7;
        in_XMM13._6_2_ = auVar38._6_2_ * sVar9;
        in_XMM13._8_2_ = auVar38._8_2_ * sVar7;
        in_XMM13._10_2_ = auVar38._10_2_ * sVar9;
        in_XMM13._12_2_ = auVar38._12_2_ * sVar7;
        in_XMM13._14_2_ = auVar38._14_2_ * sVar9;
        sVar7 = auVar8._0_2_;
        sVar9 = auVar8._2_2_;
        sVar39 = auVar27._2_2_;
        sVar40 = auVar27._4_2_;
        sVar41 = auVar27._6_2_;
        sVar42 = auVar27._8_2_;
        sVar43 = auVar27._10_2_;
        sVar44 = auVar27._12_2_;
        sVar45 = auVar27._14_2_;
        sVar23 = auVar24._0_2_;
        sVar25 = auVar24._2_2_;
        lVar19 = auVar20._0_8_;
        uVar46 = (ushort)(sVar30 * sVar23 + sVar26 * sVar10 + sVar13 + auVar27._0_2_ * sVar7 +
                         in_XMM13._0_2_) >> lVar19;
        uVar47 = (ushort)(sVar31 * sVar25 + sVar28 * sVar12 + sVar15 + sVar39 * sVar9 +
                         in_XMM13._2_2_) >> lVar19;
        uVar48 = (ushort)(sVar32 * sVar23 + sVar26 * sVar10 + sVar13 + sVar40 * sVar7 +
                         in_XMM13._4_2_) >> lVar19;
        uVar49 = (ushort)(sVar33 * sVar25 + sVar28 * sVar12 + sVar15 + sVar41 * sVar9 +
                         in_XMM13._6_2_) >> lVar19;
        uVar50 = (ushort)(sVar34 * sVar23 + sVar26 * sVar10 + sVar13 + sVar42 * sVar7 +
                         in_XMM13._8_2_) >> lVar19;
        uVar51 = (ushort)(sVar35 * sVar25 + sVar28 * sVar12 + sVar15 + sVar43 * sVar9 +
                         in_XMM13._10_2_) >> lVar19;
        uVar52 = (ushort)(sVar36 * sVar23 + sVar26 * sVar10 + sVar13 + sVar44 * sVar7 +
                         in_XMM13._12_2_) >> lVar19;
        uVar53 = (ushort)(sVar37 * sVar25 + sVar28 * sVar12 + sVar15 + sVar45 * sVar9 +
                         in_XMM13._14_2_) >> lVar19;
        *(ulong *)(pu1_dst + uVar6) =
             CONCAT17((0 < (short)uVar53) * ((short)uVar53 < 0x100) * (char)uVar53 -
                      (0xff < (short)uVar53),
                      CONCAT16((0 < (short)uVar52) * ((short)uVar52 < 0x100) * (char)uVar52 -
                               (0xff < (short)uVar52),
                               CONCAT15((0 < (short)uVar51) * ((short)uVar51 < 0x100) * (char)uVar51
                                        - (0xff < (short)uVar51),
                                        CONCAT14((0 < (short)uVar50) * ((short)uVar50 < 0x100) *
                                                 (char)uVar50 - (0xff < (short)uVar50),
                                                 CONCAT13((0 < (short)uVar49) *
                                                          ((short)uVar49 < 0x100) * (char)uVar49 -
                                                          (0xff < (short)uVar49),
                                                          CONCAT12((0 < (short)uVar48) *
                                                                   ((short)uVar48 < 0x100) *
                                                                   (char)uVar48 -
                                                                   (0xff < (short)uVar48),
                                                                   CONCAT11((0 < (short)uVar47) *
                                                                            ((short)uVar47 < 0x100)
                                                                            * (char)uVar47 -
                                                                            (0xff < (short)uVar47),
                                                                            (0 < (short)uVar46) *
                                                                            ((short)uVar46 < 0x100)
                                                                            * (char)uVar46 -
                                                                            (0xff < (short)uVar46)))
                                                         )))));
        sVar30 = sVar30 + auVar21._0_2_;
        sVar31 = sVar31 + auVar21._2_2_;
        sVar32 = sVar32 + auVar21._4_2_;
        sVar33 = sVar33 + auVar21._6_2_;
        sVar34 = sVar34 + auVar21._8_2_;
        sVar35 = sVar35 + auVar21._10_2_;
        sVar36 = sVar36 + auVar21._12_2_;
        sVar37 = sVar37 + auVar21._14_2_;
        auVar27._0_2_ = auVar27._0_2_ + auVar22._0_2_;
        auVar27._2_2_ = sVar39 + auVar22._2_2_;
        auVar27._4_2_ = sVar40 + auVar22._4_2_;
        auVar27._6_2_ = sVar41 + auVar22._6_2_;
        auVar27._8_2_ = sVar42 + auVar22._8_2_;
        auVar27._10_2_ = sVar43 + auVar22._10_2_;
        auVar27._12_2_ = sVar44 + auVar22._12_2_;
        auVar27._14_2_ = sVar45 + auVar22._14_2_;
        uVar6 = uVar6 + 8;
      } while (uVar6 < (uint)(nt * 2));
      pu1_dst = pu1_dst + dst_strd;
    } while (uVar4 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_planar_sse42(UWORD8 *pu1_ref,
                                          WORD32 src_strd,
                                          UWORD8 *pu1_dst,
                                          WORD32 dst_strd,
                                          WORD32 nt,
                                          WORD32 mode)
{

    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;

    __m128i const_temp_4x32b, const_temp1_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i col_8x16b, const_temp5_4x32b, const_temp6_4x32b, zero_8x16b, const_temp7_4x32b;
    UNUSED(src_strd);
    UNUSED(mode);

    switch(nt)
    {
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    /* Planar filtering */

/* setting vallues in  registera*/

//  pu1_ref[2*(two_nt - 1 - row)]
//  pu1_ref[2 * (three_nt + 1)]
//  pu1_ref[2 * (two_nt + 1) + col]
//  pu1_ref[2 * (nt - 1)]

    const_temp_4x32b  = _mm_set_epi16(pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)], pu1_ref[2 * (three_nt + 1) + 1],
                                      pu1_ref[2 * (three_nt + 1)], pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)],
                                      pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)]);

    const_temp1_4x32b = _mm_set_epi16(pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)], pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)],
                                      pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)], pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)]);

    const_temp4_4x32b = _mm_set1_epi16(nt - 1);
    const_temp6_4x32b = _mm_set1_epi16(nt);
    const_temp7_4x32b = _mm_set1_epi16(4);

    zero_8x16b = _mm_set1_epi32(0);

    if(nt % 4 == 0)
    {
        const_temp7_4x32b = _mm_set1_epi16(4);

        for(row = 0; row < nt; row++)
        {
            __m128i res_temp_8x16b, row_8x16b, res_temp1_8x16b, res_temp2_8x16b;
            __m128i res_temp3_8x16b;

            const_temp2_4x32b  = _mm_set_epi16(pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)], pu1_ref[2 * (two_nt - 1 - row) + 1],
                                               pu1_ref[2 * (two_nt - 1 - row)], pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)],
                                               pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)]);

            const_temp3_4x32b  = _mm_set1_epi16((row + 1));
            row_8x16b = _mm_set1_epi16((nt - 1 - row));

            const_temp5_4x32b = _mm_set_epi16(3, 3, 2, 2, 1, 1, 0, 0);
            col_8x16b = _mm_set_epi16(4, 4, 3, 3, 2, 2, 1, 1);

            const_temp5_4x32b = _mm_sub_epi16(const_temp4_4x32b, const_temp5_4x32b);

            /*(row + 1) * pu1_ref[nt - 1]*/
            res_temp_8x16b  = _mm_mullo_epi16(const_temp3_4x32b,  const_temp1_4x32b);

            /*(row + 1) * pu1_ref[nt - 1] + nt)*/
            res_temp_8x16b = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);

            for(col = 0; col < 2 * nt; col += 8)
            {
                __m128i src_temp_8x16b;

                /* loding 8bit 16 pixles*/
                src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + 2 * (two_nt + 1) + col));

                src_temp_8x16b =  _mm_cvtepu8_epi16(src_temp_8x16b); /* row=0*/

                /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] */
                res_temp1_8x16b  = _mm_mullo_epi16(src_temp_8x16b,  row_8x16b);

                /*(col + 1) * pu1_ref[three_nt + 1]*/
                res_temp2_8x16b  = _mm_mullo_epi16(const_temp_4x32b,  col_8x16b);

                /*(nt - 1 - col)* pu1_ref[two_nt - 1 - row]*/
                res_temp3_8x16b  = _mm_mullo_epi16(const_temp2_4x32b,  const_temp5_4x32b);

                res_temp1_8x16b = _mm_add_epi16(res_temp_8x16b, res_temp1_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp3_8x16b);

                res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, (log2nt + 1));
                res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);

                _mm_storel_epi64((__m128i *)(pu1_dst + (row * dst_strd) + col), res_temp1_8x16b);

                const_temp5_4x32b = _mm_sub_epi16(const_temp5_4x32b, const_temp7_4x32b);
                col_8x16b = _mm_add_epi16(col_8x16b, const_temp7_4x32b);
            } /* inner loop ends here */
        }
    }
}